

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv.hpp
# Opt level: O1

void __thiscall
mio::basic_mmap<(mio::access_mode)0,_char>::map
          (basic_mmap<(mio::access_mode)0,_char> *this,handle_type handle,size_type offset,
          size_type length,error_code *error)

{
  int iVar1;
  error_category *peVar2;
  void *pvVar3;
  pointer pvVar4;
  int *piVar5;
  size_t __len;
  long __offset;
  size_type sVar6;
  stat local_c0;
  
  peVar2 = (error_category *)std::_V2::system_category();
  error->_M_value = 0;
  error->_M_cat = peVar2;
  if (handle == -1) {
    peVar2 = (error_category *)std::_V2::generic_category();
    error->_M_value = 9;
  }
  else {
    error->_M_value = 0;
    error->_M_cat = peVar2;
    iVar1 = fstat(handle,&local_c0);
    if (iVar1 == -1) {
      piVar5 = __errno_location();
      error->_M_value = *piVar5;
      error->_M_cat = peVar2;
      local_c0.st_size = 0;
    }
    if (error->_M_value != 0) {
      return;
    }
    if (offset + length <= (ulong)local_c0.st_size) {
      sVar6 = local_c0.st_size - offset;
      if (length != 0) {
        sVar6 = length;
      }
      if (page_size()::page_size == '\0') {
        basic_mmap<(mio::access_mode)0,char>::map();
      }
      __offset = offset - offset % page_size()::page_size;
      __len = offset % page_size()::page_size + sVar6;
      pvVar3 = mmap((void *)0x0,__len,1,1,handle,__offset);
      if (pvVar3 == (void *)0xffffffffffffffff) {
        piVar5 = __errno_location();
        error->_M_value = *piVar5;
        error->_M_cat = peVar2;
        pvVar4 = (pointer)0x0;
        sVar6 = 0;
        __len = 0;
      }
      else {
        pvVar4 = (pointer)((long)pvVar3 + (offset - __offset));
      }
      if (error->_M_value != 0) {
        return;
      }
      unmap(this);
      this->file_handle_ = handle;
      this->is_handle_internal_ = false;
      this->data_ = pvVar4;
      this->length_ = sVar6;
      this->mapped_length_ = __len;
      return;
    }
    peVar2 = (error_category *)std::_V2::generic_category();
    error->_M_value = 0x16;
  }
  error->_M_cat = peVar2;
  return;
}

Assistant:

void basic_mmap<AccessMode, ByteT>::map(const handle_type handle,
        const size_type offset, const size_type length, std::error_code& error)
{
    error.clear();
    if(handle == invalid_handle)
    {
        error = std::make_error_code(std::errc::bad_file_descriptor);
        return;
    }

    const auto file_size = detail::query_file_size(handle, error);
    if(error)
    {
        return;
    }

    if(offset + length > file_size)
    {
        error = std::make_error_code(std::errc::invalid_argument);
        return;
    }

    const auto ctx = detail::memory_map(handle, offset,
            length == map_entire_file ? (file_size - offset) : length,
            AccessMode, error);
    if(!error)
    {
        // We must unmap the previous mapping that may have existed prior to this call.
        // Note that this must only be invoked after a new mapping has been created in
        // order to provide the strong guarantee that, should the new mapping fail, the
        // `map` function leaves this instance in a state as though the function had
        // never been invoked.
        unmap();
        file_handle_ = handle;
        is_handle_internal_ = false;
        data_ = reinterpret_cast<pointer>(ctx.data);
        length_ = ctx.length;
        mapped_length_ = ctx.mapped_length;
#ifdef _WIN32
        file_mapping_handle_ = ctx.file_mapping_handle;
#endif
    }
}